

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O3

forward_list<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
 __thiscall
RenX::LadderDatabase::getPlayerEntriesAndIndexByPartName
          (LadderDatabase *this,string_view name,size_t max)

{
  Entry *__args;
  size_t sVar1;
  _Node *p_Var2;
  _Fwd_list_node_base *__to;
  long in_R8;
  Entry *itr;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_substring;
  basic_string_view<char,_std::char_traits<char>_> in_substring_00;
  size_t index;
  unsigned_long local_38;
  
  in_substring._M_len = name._M_str;
  *(undefined8 *)this = 0;
  local_38 = 0;
  __args = *(Entry **)(name._M_len + 0x50);
  if (in_R8 == 0) {
    for (; __args != (Entry *)0x0; __args = __args->next) {
      in_string_00._M_str = (__args->most_recent_name)._M_dataplus._M_p;
      in_string_00._M_len = (__args->most_recent_name)._M_string_length;
      in_substring_00._M_str = (char *)max;
      in_substring_00._M_len = (size_t)in_substring._M_len;
      sVar1 = jessilib::find<char,char,false>(in_string_00,in_substring_00);
      if (sVar1 != 0xffffffffffffffff) {
        p_Var2 = std::
                 _Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
                 ::_M_create_node<RenX::LadderDatabase::Entry&,unsigned_long&>
                           ((_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
                             *)this,__args,&local_38);
        (p_Var2->super__Fwd_list_node_base)._M_next = *(_Fwd_list_node_base **)this;
        *(_Node **)this = p_Var2;
      }
      local_38 = local_38 + 1;
    }
  }
  else {
    for (; __args != (Entry *)0x0; __args = __args->next) {
      in_string._M_str = (__args->most_recent_name)._M_dataplus._M_p;
      in_string._M_len = (__args->most_recent_name)._M_string_length;
      in_substring._M_str = (char *)max;
      sVar1 = jessilib::find<char,char,false>(in_string,in_substring);
      if (sVar1 != 0xffffffffffffffff) {
        p_Var2 = std::
                 _Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
                 ::_M_create_node<RenX::LadderDatabase::Entry&,unsigned_long&>
                           ((_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,unsigned_long>,std::allocator<std::pair<RenX::LadderDatabase::Entry,unsigned_long>>>
                             *)this,__args,&local_38);
        (p_Var2->super__Fwd_list_node_base)._M_next = *(_Fwd_list_node_base **)this;
        *(_Node **)this = p_Var2;
        if (in_R8 != 1) {
          return (_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
                  )(_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
                    )this;
        }
        in_R8 = 0;
      }
      local_38 = local_38 + 1;
    }
  }
  return (_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
          )(_Fwd_list_base<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>,_std::allocator<std::pair<RenX::LadderDatabase::Entry,_unsigned_long>_>_>
            )this;
}

Assistant:

std::forward_list<std::pair<RenX::LadderDatabase::Entry, size_t>> RenX::LadderDatabase::getPlayerEntriesAndIndexByPartName(std::string_view name, size_t max) const {
	std::forward_list<std::pair<Entry, size_t>> list;
	size_t index = 0;
	if (max == 0)
	{
		for (Entry *itr = m_head; itr != nullptr; itr = itr->next, ++index) {
			if (jessilib::findi(itr->most_recent_name, name) != std::string::npos) {
				list.emplace_front(*itr, index);
			}
		}
	}
	else {
		for (Entry* itr = m_head; itr != nullptr; itr = itr->next, ++index) {
			if (jessilib::findi(itr->most_recent_name, name) != std::string::npos) {
				list.emplace_front(*itr, index);
				if (--max) {
					return list;
				}
			}
		}
	}
	return list;
}